

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall capnp::compiler::Compiler::Node::loadFinalSchema(Node *this,SchemaLoader *loader)

{
  size_t capacity;
  Maybe<capnp::schema::Node::Reader> *pMVar1;
  Schema SVar2;
  long lVar3;
  Reader *reader;
  Reader *reader_00;
  NullableValue<kj::Exception> _exception655;
  Reader local_538;
  Schema local_500 [52];
  Node local_360;
  
  getContent(&local_360,(State)this);
  lVar3 = CONCAT71(local_360.super_Resolver._vptr_Resolver._1_7_,
                   local_360.super_Resolver._vptr_Resolver._0_1_);
  if (lVar3 != 0) {
    reader_00 = (Reader *)0x0;
    if (*(char *)(lVar3 + 0xa0) != '\0') {
      reader_00 = (Reader *)(lVar3 + 0xa8);
    }
    if (*(char *)(lVar3 + 0xa0) == '\x01') {
      capacity = *(size_t *)(lVar3 + 0xe0);
      local_538._reader.segment =
           (SegmentReader *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_538._reader.data = &(local_538._reader.segment)->arena + capacity;
      local_538._reader.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
      local_538._reader.capTable = (CapTableReader *)local_538._reader.segment;
      if (*(long *)(lVar3 + 0xe0) != 0) {
        reader = *(Reader **)(lVar3 + 0xd8);
        do {
          SVar2 = SchemaLoader::loadOnce(loader,reader);
          (local_538._reader.capTable)->_vptr_CapTableReader = (_func_int **)SVar2.raw;
          local_538._reader.capTable = (CapTableReader *)((long)local_538._reader.capTable + 8);
          reader = reader + 1;
        } while (reader != (Reader *)(*(long *)(lVar3 + 0xe0) * 0x30 + *(long *)(lVar3 + 0xd8)));
      }
      if (local_538._reader.segment != (SegmentReader *)0x0) {
        lVar3 = (long)local_538._reader.capTable - (long)local_538._reader.segment >> 3;
        (**(code **)*local_538._reader.pointers)
                  (local_538._reader.pointers,local_538._reader.segment,8,lVar3,lVar3,0);
      }
      local_500[0] = SchemaLoader::loadOnce(loader,reader_00);
      Schema::getProto(&local_538,local_500);
      if ((this->loadedFinalSchema).ptr.isSet == true) {
        (this->loadedFinalSchema).ptr.isSet = false;
      }
      pMVar1 = &this->loadedFinalSchema;
      *(StructDataBitCount *)((long)&(pMVar1->ptr).field_1 + 0x20) = local_538._reader.dataSize;
      *(StructPointerCount *)((long)&(pMVar1->ptr).field_1 + 0x24) = local_538._reader.pointerCount;
      *(undefined2 *)((long)&(pMVar1->ptr).field_1 + 0x26) = local_538._reader._38_2_;
      *(int *)((long)&(this->loadedFinalSchema).ptr.field_1 + 0x28) = local_538._reader.nestingLimit
      ;
      *(undefined4 *)((long)&(this->loadedFinalSchema).ptr.field_1 + 0x2c) =
           local_538._reader._44_4_;
      (this->loadedFinalSchema).ptr.field_1.value._reader.data = local_538._reader.data;
      (this->loadedFinalSchema).ptr.field_1.value._reader.pointers = local_538._reader.pointers;
      (this->loadedFinalSchema).ptr.field_1.value._reader.segment = local_538._reader.segment;
      (this->loadedFinalSchema).ptr.field_1.value._reader.capTable = local_538._reader.capTable;
      (this->loadedFinalSchema).ptr.isSet = true;
    }
  }
  return;
}

Assistant:

void Compiler::Node::loadFinalSchema(const SchemaLoader& loader) {
  KJ_IF_SOME(content, getContent(Content::FINISHED)) {
    KJ_IF_SOME(exception, kj::runCatchingExceptions([&](){
      KJ_IF_SOME(finalSchema, content.finalSchema) {
        KJ_MAP(auxSchema, content.auxSchemas) {
          return loader.loadOnce(auxSchema);
        };
        loadedFinalSchema = loader.loadOnce(finalSchema).getProto();
      }
    })) {
      // Schema validation threw an exception.

      // Don't try loading this again.
      content.finalSchema = kj::none;

      // Only bother to report validation failures if we think we haven't seen any errors.
      // Otherwise we assume that the errors caused the validation failure.
      if (!module->getErrorReporter().hadErrors()) {
        addError(kj::str("Internal compiler bug: Schema failed validation:\n", exception));
      }
    }
  }
}